

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

int Mkdir(char *dir,mode_t *mode)

{
  int iVar1;
  
  if (mode != (mode_t *)0x0) {
    iVar1 = mkdir(dir,*mode);
    return iVar1;
  }
  iVar1 = mkdir(dir,0x1ff);
  return iVar1;
}

Assistant:

inline int Mkdir(const char* dir, const mode_t* mode)
{
#if defined(_WIN32)
  int ret = _wmkdir(cmSystemTools::ConvertToWindowsExtendedPath(dir).c_str());
  if (ret == 0 && mode)
    cmSystemTools::SystemTools::SetPermissions(dir, *mode);
  return ret;
#else
  return mkdir(dir, mode ? *mode : 0777);
#endif
}